

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strrchr.c
# Opt level: O1

char * strrchr(char *__s,int __c)

{
  char *pcVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    pcVar1 = __s + lVar2;
    lVar2 = lVar2 + 1;
  } while (*pcVar1 != '\0');
  do {
    if ((char)__c == __s[lVar2 + -1]) {
      return __s + lVar2 + -1;
    }
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  return (char *)0x0;
}

Assistant:

char * strrchr( const char * s, int c )
{
    size_t i = 0;

    while ( s[i++] )
    {
        /* EMPTY */
    }

    do
    {
        if ( s[--i] == ( char ) c )
        {
            return ( char * ) s + i;
        }
    } while ( i );

    return NULL;
}